

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
IgnoredUtestShell::runOneTest(IgnoredUtestShell *this,TestPlugin *plugin,TestResult *result)

{
  TestResult *result_local;
  TestPlugin *plugin_local;
  IgnoredUtestShell *this_local;
  
  if (((this->super_UtestShell).field_0x32 & 1) == 0) {
    (*result->_vptr_TestResult[0xc])();
  }
  else {
    UtestShell::runOneTest(&this->super_UtestShell,plugin,result);
  }
  return;
}

Assistant:

void IgnoredUtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    if (runIgnored_)
    {
        UtestShell::runOneTest(plugin, result);
        return;
    }

    result.countIgnored();
}